

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O1

void __thiscall
ncnn::Mat::create(Mat *this,int _w,int _h,int _c,size_t _elemsize,Allocator *_allocator)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int *piVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  void *pvVar9;
  void *pvVar10;
  long lVar11;
  undefined1 auVar12 [16];
  
  uVar1 = this->dims;
  uVar2 = this->w;
  uVar3 = this->h;
  uVar4 = this->c;
  auVar12._0_4_ = -(uint)(uVar1 == 3);
  auVar12._4_4_ = -(uint)(_w == uVar2);
  auVar12._8_4_ = -(uint)(_h == uVar3);
  auVar12._12_4_ = -(uint)(_c == uVar4);
  iVar6 = movmskps(3,auVar12);
  if (((iVar6 != 0xf) || (this->allocator != _allocator)) || (this->elemsize != _elemsize)) {
    piVar5 = this->refcount;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if (this->allocator == (Allocator *)0x0) {
          if (this->data != (void *)0x0) {
            free(*(void **)((long)this->data + -8));
          }
        }
        else {
          (**(code **)(*(long *)this->allocator + 8))();
        }
      }
    }
    this->data = (void *)0x0;
    this->refcount = (int *)0x0;
    this->elemsize = 0;
    this->cstep = 0;
    this->dims = 0;
    this->w = 0;
    this->h = 0;
    this->c = 0;
    this->elemsize = _elemsize;
    this->allocator = _allocator;
    this->dims = 3;
    this->w = _w;
    this->h = _h;
    this->c = _c;
    uVar7 = (long)(_h * _w) * _elemsize + 0xf & 0xfffffffffffffff0;
    uVar8 = uVar7 / _elemsize;
    this->cstep = uVar8;
    lVar11 = (long)_c * uVar8;
    if (lVar11 != 0) {
      uVar8 = lVar11 * _elemsize + 3 & 0xfffffffffffffffc;
      if (_allocator == (Allocator *)0x0) {
        pvVar10 = malloc(uVar8 + 0x1c);
        pvVar9 = (void *)((long)pvVar10 + 0x17U & 0xfffffffffffffff0);
        *(void **)((long)pvVar9 - 8) = pvVar10;
      }
      else {
        pvVar9 = (void *)(*(code *)**(undefined8 **)_allocator)
                                   (_allocator,uVar8 + 4,uVar7 % _elemsize);
      }
      this->data = pvVar9;
      this->refcount = (int *)((long)pvVar9 + uVar8);
      *(undefined4 *)((long)pvVar9 + uVar8) = 1;
    }
  }
  return;
}

Assistant:

inline void Mat::create(int _w, int _h, int _c, size_t _elemsize, Allocator* _allocator)
{
    if (dims == 3 && w == _w && h == _h && c == _c && elemsize == _elemsize && allocator == _allocator)
        return;

    release();

    elemsize = _elemsize;
    allocator = _allocator;

    dims = 3;
    w = _w;
    h = _h;
    c = _c;

    cstep = alignSize(w * h * elemsize, 16) / elemsize;

    if (total() > 0)
    {
        size_t totalsize = alignSize(total() * elemsize, 4);
        if (allocator)
            data = allocator->fastMalloc(totalsize + (int)sizeof(*refcount));
        else
            data = fastMalloc(totalsize + (int)sizeof(*refcount));
        refcount = (int*)(((unsigned char*)data) + totalsize);
        *refcount = 1;
    }
}